

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *__s;
  sqlite3_vtab_cursor *psVar2;
  int iVar3;
  
  iVar1 = sqlite3_initialize();
  iVar3 = 7;
  if (iVar1 == 0) {
    __s = (sqlite3_vtab_cursor *)sqlite3Malloc(0x128);
    psVar2 = (sqlite3_vtab_cursor *)0x0;
    if (__s != (sqlite3_vtab_cursor *)0x0) {
      memset(__s,0,0x128);
      __s->pVtab = pVTab;
      *(int *)&pVTab[3].zErrMsg = *(int *)&pVTab[3].zErrMsg + 1;
      iVar3 = 0;
      psVar2 = __s;
    }
  }
  else {
    psVar2 = (sqlite3_vtab_cursor *)0x0;
  }
  *ppCursor = psVar2;
  return iVar3;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}